

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::rule::
replace_top<pstore::exchange::import_ns::bss_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
          (rule *this,section_kind args,string_mapping *args_1,section_content *args_2,
          back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
          *args_3)

{
  iterator *piVar1;
  context *pcVar2;
  _Elt_pointer puVar3;
  undefined1 auVar4 [16];
  rule *prVar5;
  ulong uVar6;
  undefined7 in_register_00000031;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_50;
  undefined4 local_44;
  not_null<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_*>
  local_40;
  not_null<pstore::repo::section_content_*> local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000031,args);
  prVar5 = (rule *)operator_new(0x40);
  pcVar2 = (this->context_).ptr_;
  local_50._M_head_impl = (rule *)args_1;
  gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>::ensure_invariant
            ((not_null<const_pstore::exchange::import_ns::string_mapping_*> *)&local_50);
  local_38.ptr_ = args_2;
  gsl::not_null<pstore::repo::section_content_*>::ensure_invariant(&local_38);
  local_40.ptr_ = args_3;
  gsl::
  not_null<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_*>
  ::ensure_invariant(&local_40);
  (prVar5->context_).ptr_ = pcVar2;
  prVar5->_vptr_rule = (_func_int **)&PTR__rule_00233de0;
  *(char *)&prVar5[1]._vptr_rule = (char)local_44;
  prVar5[1].context_.ptr_ = (context *)local_38.ptr_;
  prVar5[2]._vptr_rule = (_func_int **)local_40.ptr_;
  prVar5[2].context_.ptr_ = (context *)0x0;
  prVar5[3]._vptr_rule = (_func_int **)0x0;
  prVar5[3].context_.ptr_ = (context *)0x1;
  log_top(this,false);
  pcVar2 = (this->context_).ptr_;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ::pop_back(&(pcVar2->stack).c);
  puVar3 = (pcVar2->stack).c.
           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50._M_head_impl = prVar5;
  if (puVar3 == (pcVar2->stack).c.
                super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
    ::
    _M_push_back_aux<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
              ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
                *)&pcVar2->stack,
               (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
                *)&local_50);
    if (local_50._M_head_impl != (rule *)0x0) {
      (*(local_50._M_head_impl)->_vptr_rule[1])();
    }
  }
  else {
    (puVar3->_M_t).
    super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl = prVar5;
    piVar1 = &(pcVar2->stack).c.
              super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  log_top(this,true);
  uVar6 = std::_V2::system_category();
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar6;
  return (error_code)(auVar4 << 0x40);
}

Assistant:

std::error_code replace_top (Args... args) {
                    auto p = std::make_unique<T> (context_, args...);
                    this->log_top (false);
                    // Remember the context pointer before we destroy 'this'.
                    auto * const context = this->get_context ();
                    context->stack.pop (); // Destroys this object.
                    context->stack.push (std::move (p));
                    this->log_top (true);
                    return {};
                }